

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O3

void print_bool(string *path,bool value)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": bool: ",8);
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar2,CONCAT71(in_register_00000031,value) & 0xffffffff ^ 5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void
print_bool(std::string const& path, bool value)
{
    std::cout << path << ": bool: " << (value ? "true" : "false") << std::endl;
}